

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int storestring(char *n,char **p,int nostrip)

{
  int iVar1;
  size_t sVar2;
  char *dst;
  bool bVar3;
  char *q;
  char *e;
  int length;
  int nostrip_local;
  char **p_local;
  char *n_local;
  
  if (n == *p) {
    n_local._4_4_ = 0;
  }
  else {
    undo_checkpoint();
    e._0_4_ = 0;
    p_local = (char **)n;
    if (n != (char *)0x0) {
      if (nostrip == 0) {
        while (iVar1 = isspace((uint)*(byte *)p_local), iVar1 != 0) {
          p_local = (char **)((long)p_local + 1);
        }
      }
      sVar2 = strlen((char *)p_local);
      q = (char *)((long)p_local + sVar2);
      if (nostrip == 0) {
        while( true ) {
          bVar3 = false;
          if (p_local < q) {
            iVar1 = isspace((uint)(byte)q[-1]);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          q = q + -1;
        }
      }
      e._0_4_ = (int)q - (int)p_local;
      if ((int)e == 0) {
        p_local = (char **)0x0;
      }
    }
    if (p_local == (char **)*p) {
      n_local._4_4_ = 0;
    }
    else if ((((p_local == (char **)0x0) || (*p == (char *)0x0)) ||
             (iVar1 = strncmp((char *)p_local,*p,(long)(int)e), iVar1 != 0)) ||
            ((*p)[(int)e] != '\0')) {
      if (*p != (char *)0x0) {
        free(*p);
      }
      if ((p_local == (char **)0x0) || (*(char *)p_local == '\0')) {
        *p = (char *)0x0;
      }
      else {
        dst = (char *)malloc((long)((int)e + 1));
        fl_strlcpy(dst,(char *)p_local,(long)((int)e + 1));
        *p = dst;
      }
      set_modflag(1);
      n_local._4_4_ = 1;
    }
    else {
      n_local._4_4_ = 0;
    }
  }
  return n_local._4_4_;
}

Assistant:

int storestring(const char *n, const char * & p, int nostrip) {
  if (n == p) return 0;
  undo_checkpoint();
  int length = 0;
  if (n) { // see if blank, strip leading & trailing blanks
    if (!nostrip) while (isspace((int)(unsigned char)*n)) n++;
    const char *e = n + strlen(n);
    if (!nostrip) while (e > n && isspace((int)(unsigned char)*(e-1))) e--;
    length = e-n;
    if (!length) n = 0;
  }    
  if (n == p) return 0;
  if (n && p && !strncmp(n,p,length) && !p[length]) return 0;
  if (p) free((void *)p);
  if (!n || !*n) {
    p = 0;
  } else {
    char *q = (char *)malloc(length+1);
    strlcpy(q,n,length+1);
    p = q;
  }
  set_modflag(1);
  return 1;
}